

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

int __thiscall
icu_63::number::impl::NumberStringBuilder::remove(NumberStringBuilder *this,char *__filename)

{
  int iVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  Field *pFVar4;
  Field *pFVar5;
  int in_EDX;
  int iVar6;
  int32_t position;
  int32_t count_local;
  int32_t index_local;
  NumberStringBuilder *this_local;
  
  iVar6 = (int)__filename;
  iVar1 = iVar6 + this->fZero;
  pcVar2 = getCharPtr(this);
  pcVar3 = getCharPtr(this);
  anon_unknown.dwarf_156f03::uprv_memmove2
            (pcVar2 + iVar1,pcVar3 + (long)iVar1 + (long)in_EDX,
             (long)((this->fLength - iVar6) - in_EDX) << 1);
  pFVar4 = getFieldPtr(this);
  pFVar5 = getFieldPtr(this);
  anon_unknown.dwarf_156f03::uprv_memmove2
            (pFVar4 + iVar1,pFVar5 + (long)iVar1 + (long)in_EDX,
             (long)((this->fLength - iVar6) - in_EDX) << 2);
  this->fLength = this->fLength - in_EDX;
  return iVar1;
}

Assistant:

int32_t NumberStringBuilder::remove(int32_t index, int32_t count) {
    // TODO: Reset the heap here?  (If the string after removal can fit on stack?)
    int32_t position = index + fZero;
    uprv_memmove2(getCharPtr() + position,
            getCharPtr() + position + count,
            sizeof(char16_t) * (fLength - index - count));
    uprv_memmove2(getFieldPtr() + position,
            getFieldPtr() + position + count,
            sizeof(Field) * (fLength - index - count));
    fLength -= count;
    return position;
}